

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O2

double alex::fanout_tree::merge_nodes_upwards<int,int>
                 (int start_level,double best_cost,int num_keys,int total_keys,
                 vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                 *fanout_tree)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  uint uVar5;
  pointer pvVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar7 = (ulong)(uint)start_level;
  do {
    if ((int)(uint)uVar7 < 1) {
      return best_cost;
    }
    bVar9 = false;
    uVar5 = (1 << ((uint)uVar7 & 0x1f)) / 2;
    pvVar6 = (fanout_tree->
             super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar7;
    for (lVar8 = 0; (ulong)(~((int)uVar5 >> 0x1f) & uVar5) * 0x48 - lVar8 != 0; lVar8 = lVar8 + 0x48
        ) {
      lVar2 = *(long *)&(pvVar6->
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        )._M_impl.super__Vector_impl_data;
      if ((*(char *)(lVar2 + 0x18 + lVar8 * 2) == '\x01') &&
         (*(char *)(lVar2 + 0x60 + lVar8 * 2) == '\x01')) {
        lVar3 = *(long *)&pvVar6[-1].
                          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                          ._M_impl.super__Vector_impl_data;
        iVar1 = *(int *)(lVar3 + 0x40 + lVar8);
        if (iVar1 == 0) {
          *(undefined1 *)(lVar2 + 0x18 + lVar8 * 2) = 0;
          *(undefined1 *)(lVar2 + 0x60 + lVar8 * 2) = 0;
          *(undefined1 *)(lVar3 + 0x18 + lVar8) = 1;
          dVar4 = (double)total_keys * 9.999999999999999e-05;
        }
        else {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(lVar2 + 8 + lVar8 * 2);
          dVar10 = (double)iVar1;
          auVar13 = vmovhpd_avx(auVar12,*(undefined8 *)(lVar2 + 0x50 + lVar8 * 2));
          auVar12 = vpinsrd_avx(ZEXT416(*(uint *)(lVar2 + 0x40 + lVar8 * 2)),
                                *(undefined4 *)(lVar2 + 0x88 + lVar8 * 2),1);
          auVar12 = vcvtdq2pd_avx(auVar12);
          auVar11._0_8_ = auVar13._0_8_ * auVar12._0_8_;
          auVar11._8_8_ = auVar13._8_8_ * auVar12._8_8_;
          auVar13._8_8_ = dVar10;
          auVar13._0_8_ = dVar10;
          auVar12 = vdivpd_avx(auVar11,auVar13);
          dVar4 = ((double)total_keys * 9.999999999999999e-05) / dVar10 +
                  ((auVar12._0_8_ + auVar12._8_8_) - *(double *)(lVar3 + 8 + lVar8));
          if (dVar4 < 0.0) goto LAB_0010294d;
          *(undefined1 *)(lVar2 + 0x18 + lVar8 * 2) = 0;
          *(undefined1 *)(lVar2 + 0x60 + lVar8 * 2) = 0;
          *(undefined1 *)(lVar3 + 0x18 + lVar8) = 1;
          dVar4 = dVar4 * dVar10;
        }
        best_cost = best_cost - dVar4 / (double)num_keys;
        bVar9 = true;
      }
LAB_0010294d:
    }
    uVar7 = uVar7 - 1;
    if (!bVar9) {
      return best_cost;
    }
  } while( true );
}

Assistant:

static double merge_nodes_upwards(
    int start_level, double best_cost, int num_keys, int total_keys,
    std::vector<std::vector<FTNode>>& fanout_tree) {
  for (int level = start_level; level >= 1; level--) {
    int level_fanout = 1 << level;
    bool at_least_one_merge = false;
    for (int i = 0; i < level_fanout / 2; i++) {
      if (fanout_tree[level][2 * i].use && fanout_tree[level][2 * i + 1].use) {
        int num_node_keys = fanout_tree[level - 1][i].num_keys;
        if (num_node_keys == 0) {
          fanout_tree[level][2 * i].use = false;
          fanout_tree[level][2 * i + 1].use = false;
          fanout_tree[level - 1][i].use = true;
          at_least_one_merge = true;
          best_cost -= kModelSizeWeight * sizeof(AlexDataNode<T, P>) *
                       total_keys / num_keys;
          continue;
        }
        int num_left_keys = fanout_tree[level][2 * i].num_keys;
        int num_right_keys = fanout_tree[level][2 * i + 1].num_keys;
        double merging_cost_saving =
            (fanout_tree[level][2 * i].cost * num_left_keys / num_node_keys) +
            (fanout_tree[level][2 * i + 1].cost * num_right_keys /
             num_node_keys) -
            fanout_tree[level - 1][i].cost +
            (kModelSizeWeight * sizeof(AlexDataNode<T, P>) * total_keys /
             num_node_keys);
        if (merging_cost_saving >= 0) {
          fanout_tree[level][2 * i].use = false;
          fanout_tree[level][2 * i + 1].use = false;
          fanout_tree[level - 1][i].use = true;
          best_cost -= merging_cost_saving * num_node_keys / num_keys;
          at_least_one_merge = true;
        }
      }
    }
    if (!at_least_one_merge) {
      break;
    }
  }
  return best_cost;
}